

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O1

Result * __thiscall
CoreML::LinearModel::setOffsets
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<double,_std::allocator<double>_> *offsets)

{
  double dVar1;
  int iVar2;
  Model *this_00;
  double *pdVar3;
  GLMRegressor *pGVar4;
  double *pdVar5;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 300) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 300;
    pGVar4 = (GLMRegressor *)operator_new(0x48);
    Specification::GLMRegressor::GLMRegressor(pGVar4);
    (this_00->Type_).glmregressor_ = pGVar4;
  }
  pdVar5 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar3) {
    pGVar4 = (this_00->Type_).glmregressor_;
    do {
      dVar1 = *pdVar5;
      iVar2 = (pGVar4->offset_).total_size_;
      if ((pGVar4->offset_).current_size_ == iVar2) {
        google::protobuf::RepeatedField<double>::Reserve(&pGVar4->offset_,iVar2 + 1);
      }
      iVar2 = (pGVar4->offset_).current_size_;
      (pGVar4->offset_).current_size_ = iVar2 + 1;
      ((pGVar4->offset_).rep_)->elements[iVar2] = dVar1;
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar3);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setOffsets(std::vector<double> offsets) {
        auto lr = m_spec->mutable_glmregressor();
        for(double n : offsets) {
            lr->add_offset(n);
        }
        return Result();
    }